

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

bool __thiscall
trompeloeil::call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
::match_conditions(call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
                   *this,call_params_type_t<int_(int,_int)> *params)

{
  bool bVar1;
  condition_base<int_(int,_int)> *pcVar2;
  ulong uVar3;
  condition_base<int_(int,_int)> *c;
  iterator __end0;
  iterator __begin0;
  condition_list<int_(int,_int)> *__range2;
  call_params_type_t<int_(int,_int)> *params_local;
  call_matcher<int_(int,_int),_std::tuple<trompeloeil::wildcard,_trompeloeil::wildcard>_>
  *this_local;
  
  __end0 = list<trompeloeil::condition_base<int_(int,_int)>,_trompeloeil::delete_disposer>::begin
                     (&this->conditions);
  c = (condition_base<int_(int,_int)> *)
      list<trompeloeil::condition_base<int_(int,_int)>,_trompeloeil::delete_disposer>::end
                (&this->conditions);
  while( true ) {
    bVar1 = trompeloeil::operator!=(&__end0,(iterator *)&c);
    if (!bVar1) {
      return true;
    }
    pcVar2 = list<trompeloeil::condition_base<int_(int,_int)>,_trompeloeil::delete_disposer>::
             iterator::operator*(&__end0);
    uVar3 = (**(code **)(*(long *)pcVar2 + 0x10))(pcVar2,params);
    if ((uVar3 & 1) == 0) break;
    list<trompeloeil::condition_base<int_(int,_int)>,_trompeloeil::delete_disposer>::iterator::
    operator++(&__end0);
  }
  return false;
}

Assistant:

bool
    match_conditions(
      call_params_type_t<Sig> const & params)
    const
    {
      // std::all_of() is almost always preferable. The only reason
      // for using a hand rolled loop is because it cuts compilation
      // times quite noticeably (almost 10% with g++5.1)
      for (auto& c : conditions)
      {
        if (!c.check(params)) return false;
      }
      return true;
    }